

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexBindingStrideCase::test
          (VertexBindingStrideCase *this,ResultCollector *result)

{
  deUint32 *this_00;
  int iVar1;
  deUint32 dVar2;
  deBool dVar3;
  deUint32 buffer_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  Enum<int,_2UL> EVar6;
  GetNameFunc local_680;
  int local_678;
  string local_670;
  allocator<char> local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  GLenum local_5c8;
  GLsizei local_5c4;
  deUint32 err_5;
  int stride;
  int binding_1;
  int randomTestNdx;
  int numRandomTests;
  Random rnd;
  allocator<char> local_579;
  string local_578;
  ScopedLogSection local_558;
  ScopedLogSection section_2;
  TestLog *local_540;
  int local_538;
  string local_530;
  allocator<char> local_509;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  GLenum local_484;
  GetNameFunc p_Stack_480;
  deUint32 err_4;
  int local_478;
  GetNameFunc local_470;
  int local_468;
  string local_460;
  allocator<char> local_439;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  GLenum local_3b4;
  GetNameFunc p_Stack_3b0;
  deUint32 err_3;
  int local_3a8;
  GetNameFunc local_3a0;
  int local_398;
  string local_390;
  allocator<char> local_369;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  GLenum local_2e4;
  GetNameFunc p_Stack_2e0;
  deUint32 err_2;
  int local_2d8;
  GetNameFunc local_2d0;
  int local_2c8;
  string local_2c0;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  GLenum local_214;
  undefined1 local_210 [4];
  deUint32 err_1;
  VertexArray otherVao;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  ScopedLogSection local_1a8;
  ScopedLogSection section_1;
  int binding;
  allocator<char> local_171;
  string local_170;
  ScopedLogSection local_150;
  ScopedLogSection section;
  TestLog *local_138;
  int local_130;
  string local_128;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  GLenum local_7c;
  int local_78;
  deUint32 err;
  GLint maxBindings;
  GLint reportedMaxBindings;
  Buffer buffer;
  undefined1 local_48 [8];
  VertexArray vao;
  CallLogWrapper gl;
  ResultCollector *result_local;
  VertexBindingStrideCase *this_local;
  
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar5);
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48,pRVar4);
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&maxBindings,pRVar4);
  err = 0xffffffff;
  this_00 = &vao.super_ObjectWrapper.m_object;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)this_00,true);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)this_00,dVar2);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82da,(GLint *)&err);
  do {
    local_7c = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
    if (local_7c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Got Error ",&local_101);
      EVar6 = glu::getErrorStr(local_7c);
      section.m_log = (TestLog *)EVar6.m_getName;
      local_130 = EVar6.m_value;
      local_138 = section.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_128,&local_138);
      std::operator+(&local_e0,&local_100,&local_128);
      std::operator+(&local_c0,&local_e0,": ");
      std::operator+(&local_a0,&local_c0,"glGetIntegerv");
      tcu::ResultCollector::fail(result,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  local_78 = de::max<int>(0x10,err);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"initial",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&binding,"Initial values",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_150,pTVar5,&local_170,(string *)&binding);
  std::__cxx11::string::~string((string *)&binding);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  for (section_1.m_log._0_4_ = 0; (int)section_1.m_log < local_78;
      section_1.m_log._0_4_ = (int)section_1.m_log + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82d8,
               (int)section_1.m_log,0x10,(this->super_IndexedCase).m_verifier);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_150);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"vao",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"VAO state",
             (allocator<char> *)&otherVao.super_ObjectWrapper.field_0x17);
  tcu::ScopedLogSection::ScopedLogSection(&local_1a8,pTVar5,&local_1c8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&otherVao.super_ObjectWrapper.field_0x17);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pRVar4 = gles31::Context::getRenderContext((this->super_IndexedCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_210,pRVar4);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&maxBindings);
  glu::CallLogWrapper::glBindVertexBuffer
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,dVar2,0,0x20);
  do {
    local_214 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_214 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"Got Error ",&local_299);
      EVar6 = glu::getErrorStr(local_214);
      p_Stack_2e0 = EVar6.m_getName;
      local_2d8 = EVar6.m_value;
      local_2d0 = p_Stack_2e0;
      local_2c8 = local_2d8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2c0,&local_2d0);
      std::operator+(&local_278,&local_298,&local_2c0);
      std::operator+(&local_258,&local_278,": ");
      std::operator+(&local_238,&local_258,"glBindVertexBuffer");
      tcu::ResultCollector::fail(result,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_210);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,dVar2);
  do {
    local_2e4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_2e4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_368,"Got Error ",&local_369);
      EVar6 = glu::getErrorStr(local_2e4);
      p_Stack_3b0 = EVar6.m_getName;
      local_3a8 = EVar6.m_value;
      local_3a0 = p_Stack_3b0;
      local_398 = local_3a8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_390,&local_3a0);
      std::operator+(&local_348,&local_368,&local_390);
      std::operator+(&local_328,&local_348,": ");
      std::operator+(&local_308,&local_328,"glBindVertexArray");
      tcu::ResultCollector::fail(result,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&maxBindings);
  glu::CallLogWrapper::glBindVertexBuffer
            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,1,dVar2,0,0x40);
  do {
    local_3b4 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_3b4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_438,"Got Error ",&local_439);
      EVar6 = glu::getErrorStr(local_3b4);
      p_Stack_480 = EVar6.m_getName;
      local_478 = EVar6.m_value;
      local_470 = p_Stack_480;
      local_468 = local_478;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_460,&local_470);
      std::operator+(&local_418,&local_438,&local_460);
      std::operator+(&local_3f8,&local_418,": ");
      std::operator+(&local_3d8,&local_3f8,"glBindVertexBuffer");
      tcu::ResultCollector::fail(result,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::~string((string *)&local_438);
      std::allocator<char>::~allocator(&local_439);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,dVar2);
  do {
    local_484 = glu::CallLogWrapper::glGetError((CallLogWrapper *)&vao.super_ObjectWrapper.m_object)
    ;
    if (local_484 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_508,"Got Error ",&local_509);
      EVar6 = glu::getErrorStr(local_484);
      section_2.m_log = (TestLog *)EVar6.m_getName;
      local_538 = EVar6.m_value;
      local_540 = section_2.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_530,&local_540);
      std::operator+(&local_4e8,&local_508,&local_530);
      std::operator+(&local_4c8,&local_4e8,": ");
      std::operator+(&local_4a8,&local_4c8,"glBindVertexArray");
      tcu::ResultCollector::fail(result,&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_508);
      std::allocator<char>::~allocator(&local_509);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  deqp::gls::StateQueryUtil::verifyStateIndexedInteger
            (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82d8,1,0x20,
             (this->super_IndexedCase).m_verifier);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_210);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1a8);
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_IndexedCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"random",&local_579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rnd.m_rnd.w,"Random values",(allocator<char> *)((long)&rnd.m_rnd.z + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_558,pTVar5,&local_578,(string *)&rnd.m_rnd.w);
  std::__cxx11::string::~string((string *)&rnd.m_rnd.w);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rnd.m_rnd.z + 3));
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  de::Random::Random((Random *)&randomTestNdx,0xabc);
  binding_1 = 10;
  for (stride = 0; stride < 10; stride = stride + 1) {
    err_5 = de::Random::getInt((Random *)&randomTestNdx,0,local_78 + -1);
    local_5c4 = de::Random::getInt((Random *)&randomTestNdx,0,0x800);
    dVar2 = err_5;
    buffer_00 = glu::ObjectWrapper::operator*((ObjectWrapper *)&maxBindings);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object,dVar2,buffer_00,0,local_5c4);
    do {
      local_5c8 = glu::CallLogWrapper::glGetError
                            ((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
      if (local_5c8 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_648,"Got Error ",&local_649);
        EVar6 = glu::getErrorStr(local_5c8);
        local_680 = EVar6.m_getName;
        local_678 = EVar6.m_value;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_670,&local_680);
        std::operator+(&local_628,&local_648,&local_670);
        std::operator+(&local_608,&local_628,": ");
        std::operator+(&local_5e8,&local_608,"glBindVertexBuffer");
        tcu::ResultCollector::fail(result,&local_5e8);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::__cxx11::string::~string((string *)&local_608);
        std::__cxx11::string::~string((string *)&local_628);
        std::__cxx11::string::~string((string *)&local_670);
        std::__cxx11::string::~string((string *)&local_648);
        std::allocator<char>::~allocator(&local_649);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (result,(CallLogWrapper *)&vao.super_ObjectWrapper.m_object,0x82d8,err_5,local_5c4,
               (this->super_IndexedCase).m_verifier);
  }
  de::Random::~Random((Random *)&randomTestNdx);
  tcu::ScopedLogSection::~ScopedLogSection(&local_558);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&maxBindings);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_48);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&vao.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void VertexBindingStrideCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl					(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao					(m_context.getRenderContext());
	glu::Buffer			buffer				(m_context.getRenderContext());
	glw::GLint			reportedMaxBindings	= -1;
	glw::GLint			maxBindings;

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &reportedMaxBindings);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	maxBindings = de::max(16, reportedMaxBindings);

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int binding = 0; binding < maxBindings; ++binding)
			verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_STRIDE, binding, 16, m_verifier);
	}

	// is part of vao
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "vao", "VAO state");
		glu::VertexArray			otherVao		(m_context.getRenderContext());

		// set to value A in vao1
		gl.glBindVertexBuffer(1, *buffer, 0, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// set to value B in vao2
		gl.glBindVertexArray(*otherVao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		gl.glBindVertexBuffer(1, *buffer, 0, 64);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

		// check value is still ok in original vao
		gl.glBindVertexArray(*vao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_STRIDE, 1, 32, m_verifier);
	}

	// random values
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "random", "Random values");
		de::Random					rnd				(0xabc);
		const int					numRandomTests	= 10;

		for (int randomTestNdx = 0; randomTestNdx < numRandomTests; ++randomTestNdx)
		{
			const int	binding			= rnd.getInt(0, maxBindings-1);
			const int	stride			= rnd.getInt(0, 2048);

			gl.glBindVertexBuffer(binding, *buffer, 0, stride);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexBuffer");

			verifyStateIndexedInteger(result, gl, GL_VERTEX_BINDING_STRIDE, binding, stride, m_verifier);
		}
	}
}